

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_DynamicExtensions_Test::TestBody
          (ExtensionSetTest_DynamicExtensions_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  FileDescriptor *pFVar5;
  uint32_t *puVar6;
  Arena *pAVar7;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto> *other;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *other_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *other_01;
  FieldDescriptorProto *this_03;
  string *this_04;
  char *pcVar8;
  DescriptorPool *underlay;
  ForeignMessage *this_05;
  TestDynamicExtensions_DynamicMessageType *this_06;
  UnknownFieldSet *pUVar9;
  void *pvVar10;
  FieldDescriptor *pFVar11;
  Reflection *pRVar12;
  MessageLite *from;
  TestAllExtensions *this_07;
  Message *pMVar13;
  void *extraout_RDX;
  Message *message_00;
  AlphaNum *in_R8;
  char *in_R9;
  string_view sVar14;
  string_view prefix_00;
  AssertHelper local_a80;
  Message local_a78;
  Message *local_a70;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_3;
  Message *prototype;
  Message *sub_message_1;
  Message *parent;
  AssertHelper local_a20;
  Message local_a18;
  bool local_a09;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar__8;
  FieldDescriptor *dynamic_message_extension;
  Message local_9d8;
  int local_9d0 [2];
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_998;
  Message local_990;
  undefined1 local_981 [9];
  AssertionResult gtest_ar__7;
  ForeignMessage *typed_sub_message;
  Message *sub_message;
  AssertHelper local_940;
  Message local_938;
  bool local_929;
  undefined1 local_928 [8];
  AssertionResult gtest_ar__6;
  FieldDescriptor *message_extension;
  Message local_8f8;
  string local_8f0;
  string local_8d0;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_880;
  Message local_878;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_838;
  Message local_830;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__4;
  CodedInputStream input_1;
  ArrayInputStream raw_input_1;
  TestAllExtensions message2;
  AssertHelper local_750;
  Message local_748;
  string local_740;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__3;
  Message local_700;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar;
  string message_text;
  AssertHelper local_6a8;
  Message local_6a0;
  bool local_691;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_660;
  Message local_658;
  bool local_649;
  undefined1 local_648 [8];
  AssertionResult gtest_ar__1;
  CodedInputStream input;
  ArrayInputStream raw_input;
  TestAllExtensions message;
  undefined1 local_588 [8];
  TestDynamicExtensions message_1;
  TestDynamicExtensions dynamic_extension;
  string data;
  DynamicMessageFactory dynamic_factory;
  string local_450;
  AssertHelper local_430;
  Message local_428;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_;
  FileDescriptor *file;
  DescriptorPool dynamic_pool;
  string *type_name;
  string_view local_330;
  AlphaNum local_320;
  AlphaNum local_2f0;
  undefined1 local_2c0 [8];
  string prefix;
  FieldDescriptorProto *extension;
  undefined1 local_280 [4];
  int i;
  DescriptorProto template_descriptor_proto;
  Descriptor *template_descriptor;
  char *local_180;
  undefined1 local_168 [8];
  FileDescriptorProto dynamic_proto;
  ExtensionSetTest_DynamicExtensions_Test *this_local;
  
  dynamic_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_168);
  pDVar4 = proto2_unittest::TestDynamicExtensions::descriptor();
  pFVar5 = Descriptor::file(pDVar4);
  FileDescriptor::CopyHeadingTo(pFVar5,(FileDescriptorProto *)local_168);
  FileDescriptorProto::clear_dependency((FileDescriptorProto *)local_168);
  puVar6 = HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &dynamic_proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar6 = (byte)*puVar6 | 1;
  pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)local_168);
  ArenaStringPtr::Set((ArenaStringPtr *)
                      &dynamic_proto.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.
                       arena_,"dynamic_extensions_test.proto",pAVar7);
  pDVar4 = proto2_unittest::TestAllExtensions::descriptor();
  pFVar5 = Descriptor::file(pDVar4);
  sVar14 = FileDescriptor::name(pFVar5);
  local_180 = sVar14._M_str;
  template_descriptor = (Descriptor *)sVar14._M_len;
  FileDescriptorProto::add_dependency<std::basic_string_view<char,std::char_traits<char>>>
            ((FileDescriptorProto *)local_168,
             (basic_string_view<char,_std::char_traits<char>_> *)&template_descriptor);
  puVar6 = HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &dynamic_proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar6 = (byte)*puVar6 | 2;
  pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)local_168);
  ArenaStringPtr::Set(&dynamic_proto.field_0._impl_.name_,"dynamic_extensions",pAVar7);
  template_descriptor_proto.field_0._216_8_ = proto2_unittest::TestDynamicExtensions::descriptor();
  DescriptorProto::DescriptorProto((DescriptorProto *)local_280);
  Descriptor::CopyTo((Descriptor *)template_descriptor_proto.field_0._216_8_,
                     (DescriptorProto *)local_280);
  this_00 = FileDescriptorProto::mutable_message_type((FileDescriptorProto *)local_168);
  other = DescriptorProto::nested_type((DescriptorProto *)local_280);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom(this_00,other);
  this_01 = FileDescriptorProto::mutable_enum_type((FileDescriptorProto *)local_168);
  other_00 = DescriptorProto::enum_type((DescriptorProto *)local_280);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom(this_01,other_00);
  this_02 = FileDescriptorProto::mutable_extension((FileDescriptorProto *)local_168);
  other_01 = DescriptorProto::field((DescriptorProto *)local_280);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom(this_02,other_01);
  extension._4_4_ = 0;
  while( true ) {
    iVar3 = FileDescriptorProto::extension_size((FileDescriptorProto *)local_168);
    if (iVar3 <= extension._4_4_) break;
    this_03 = FileDescriptorProto::mutable_extension
                        ((FileDescriptorProto *)local_168,extension._4_4_);
    pDVar4 = proto2_unittest::TestAllExtensions::descriptor();
    sVar14 = Descriptor::full_name(pDVar4);
    prefix.field_2._8_8_ = sVar14._M_len;
    puVar6 = HasBits<1>::operator[](&(this_03->field_0)._impl_._has_bits_,0);
    *(byte *)puVar6 = (byte)*puVar6 | 2;
    sVar14._M_str = sVar14._M_str;
    sVar14._M_len = prefix.field_2._8_8_;
    pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)this_03);
    ArenaStringPtr::Set(&(this_03->field_0)._impl_.extendee_,sVar14,pAVar7);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2f0,".");
    sVar14 = Descriptor::full_name((Descriptor *)template_descriptor_proto.field_0._216_8_);
    local_330 = sVar14;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_320,sVar14);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&type_name,".");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2c0,(lts_20250127 *)&local_2f0,&local_320,(AlphaNum *)&type_name,
               in_R8);
    bVar2 = FieldDescriptorProto::has_type_name(this_03);
    if (bVar2) {
      this_04 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(this_03);
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_04);
      prefix_00 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2c0);
      dynamic_pool.feature_set_defaults_spec_._M_t.
      super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>,_true,_true>
            )prefix_00._M_len;
      bVar2 = absl::lts_20250127::StartsWith(sVar14,prefix_00);
      if (bVar2) {
        pcVar8 = (char *)std::__cxx11::string::size();
        std::__cxx11::string::replace((ulong)this_04,0,pcVar8);
      }
    }
    std::__cxx11::string::~string((string *)local_2c0);
    extension._4_4_ = extension._4_4_ + 1;
  }
  underlay = DescriptorPool::generated_pool();
  DescriptorPool::DescriptorPool((DescriptorPool *)&file,underlay);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )DescriptorPool::BuildFile((DescriptorPool *)&file,(FileDescriptorProto *)local_168);
  local_419 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar2) {
    testing::Message::Message(&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_450,(internal *)local_418,(AssertionResult *)0x1d2399f,"false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x4d7,pcVar8);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  if (bVar2) {
    DynamicMessageFactory::DynamicMessageFactory
              ((DynamicMessageFactory *)((long)&data.field_2 + 8),(DescriptorPool *)&file);
    DynamicMessageFactory::SetDelegateToGeneratedFactory
              ((DynamicMessageFactory *)((long)&data.field_2 + 8),true);
    std::__cxx11::string::string((string *)((long)&dynamic_extension.field_0 + 0x50));
    proto2_unittest::TestDynamicExtensions::TestDynamicExtensions
              ((TestDynamicExtensions *)((long)&message_1.field_0 + 0x50));
    proto2_unittest::TestDynamicExtensions::TestDynamicExtensions
              ((TestDynamicExtensions *)local_588);
    proto2_unittest::TestDynamicExtensions::set_scalar_extension
              ((TestDynamicExtensions *)local_588,0x7b);
    proto2_unittest::TestDynamicExtensions::set_enum_extension
              ((TestDynamicExtensions *)local_588,FOREIGN_BAR);
    proto2_unittest::TestDynamicExtensions::set_dynamic_enum_extension
              ((TestDynamicExtensions *)local_588,TestDynamicExtensions_DynamicEnumType_DYNAMIC_BAZ)
    ;
    this_05 = proto2_unittest::TestDynamicExtensions::mutable_message_extension
                        ((TestDynamicExtensions *)local_588);
    proto2_unittest::ForeignMessage::set_c(this_05,0x1c8);
    this_06 = proto2_unittest::TestDynamicExtensions::mutable_dynamic_message_extension
                        ((TestDynamicExtensions *)local_588);
    proto2_unittest::TestDynamicExtensions_DynamicMessageType::set_dynamic_field(this_06,0x315);
    proto2_unittest::TestDynamicExtensions::add_repeated_extension<char_const(&)[4]>
              ((TestDynamicExtensions *)local_588,(char (*) [4])0x1d63234);
    proto2_unittest::TestDynamicExtensions::add_repeated_extension<char_const(&)[4]>
              ((TestDynamicExtensions *)local_588,(char (*) [4])0x1eb01d8);
    proto2_unittest::TestDynamicExtensions::add_packed_extension
              ((TestDynamicExtensions *)local_588,0xc);
    proto2_unittest::TestDynamicExtensions::add_packed_extension
              ((TestDynamicExtensions *)local_588,-0x22);
    proto2_unittest::TestDynamicExtensions::add_packed_extension
              ((TestDynamicExtensions *)local_588,0x38);
    proto2_unittest::TestDynamicExtensions::add_packed_extension
              ((TestDynamicExtensions *)local_588,-0x4e);
    pUVar9 = proto2_unittest::TestDynamicExtensions::mutable_unknown_fields
                       ((TestDynamicExtensions *)local_588);
    UnknownFieldSet::AddVarint(pUVar9,0x7d2,0x3039);
    pUVar9 = proto2_unittest::TestDynamicExtensions::mutable_unknown_fields
                       ((TestDynamicExtensions *)local_588);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &message.field_0._impl_._cached_size_,"unknown");
    UnknownFieldSet::AddLengthDelimited(pUVar9,0xd431,stack0xfffffffffffffa68);
    protobuf::MessageLite::SerializeToString
              ((MessageLite *)local_588,(string *)((long)&dynamic_extension.field_0 + 0x50));
    proto2_unittest::TestDynamicExtensions::operator=
              ((TestDynamicExtensions *)((long)&message_1.field_0 + 0x50),
               (TestDynamicExtensions *)local_588);
    proto2_unittest::TestDynamicExtensions::~TestDynamicExtensions
              ((TestDynamicExtensions *)local_588);
    proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)&raw_input.position_)
    ;
    pvVar10 = (void *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::size();
    protobuf::io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)&input.extension_factory_,pvVar10,iVar3,-1);
    protobuf::io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)&gtest_ar__1.message_,
               (ZeroCopyInputStream *)&input.extension_factory_);
    protobuf::io::CodedInputStream::SetExtensionRegistry
              ((CodedInputStream *)&gtest_ar__1.message_,(DescriptorPool *)&file,
               (MessageFactory *)((long)&data.field_2 + 8));
    local_649 = protobuf::MessageLite::ParseFromCodedStream
                          ((MessageLite *)&raw_input.position_,
                           (CodedInputStream *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_648,&local_649,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar2) {
      testing::Message::Message(&local_658);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_648,
                 (AssertionResult *)"message.ParseFromCodedStream(&input)","false","true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_660,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x502,pcVar8);
      testing::internal::AssertHelper::operator=(&local_660,&local_658);
      testing::internal::AssertHelper::~AssertHelper(&local_660);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_658);
    }
    bVar2 = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    if (!bVar2) {
      local_691 = protobuf::io::CodedInputStream::ConsumedEntireMessage
                            ((CodedInputStream *)&gtest_ar__1.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_690,&local_691,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
      if (!bVar2) {
        testing::Message::Message(&local_6a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)((long)&message_text.field_2 + 8),(internal *)local_690,
                   (AssertionResult *)0x1e9589f,"false","true",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_6a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x503,pcVar8);
        testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
        testing::internal::AssertHelper::~AssertHelper(&local_6a8);
        std::__cxx11::string::~string((string *)(message_text.field_2._M_local_buf + 8));
        testing::Message::~Message(&local_6a0);
      }
      bVar2 = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
      if (!bVar2) {
        bVar2 = false;
      }
    }
    protobuf::io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar__1.message_);
    protobuf::io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&input.extension_factory_)
    ;
    if (!bVar2) {
      std::__cxx11::string::string((string *)&gtest_ar.message_);
      TextFormat::PrintToString((Message *)&raw_input.position_,(string *)&gtest_ar.message_);
      testing::internal::EqHelper::
      Compare<char[567],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_6f8,
                 "\"[dynamic_extensions.scalar_extension]: 123\\n\" \"[dynamic_extensions.enum_extension]: FOREIGN_BAR\\n\" \"[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\\n\" \"[dynamic_extensions.message_extension] {\\n\" \"  c: 456\\n\" \"}\\n\" \"[dynamic_extensions.dynamic_message_extension] {\\n\" \"  dynamic_field: 789\\n\" \"}\\n\" \"[dynamic_extensions.repeated_extension]: \\\"foo\\\"\\n\" \"[dynamic_extensions.repeated_extension]: \\\"bar\\\"\\n\" \"[dynamic_extensions.packed_extension]: 12\\n\" \"[dynamic_extensions.packed_extension]: -34\\n\" \"[dynamic_extensions.packed_extension]: 56\\n\" \"[dynamic_extensions.packed_extension]: -78\\n\" \"2002: 12345\\n\" \"54321: \\\"unknown\\\"\\n\""
                 ,"message_text",
                 (char (*) [567])
                 "[dynamic_extensions.scalar_extension]: 123\n[dynamic_extensions.enum_extension]: FOREIGN_BAR\n[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\n[dynamic_extensions.message_extension] {\n  c: 456\n}\n[dynamic_extensions.dynamic_message_extension] {\n  dynamic_field: 789\n}\n[dynamic_extensions.repeated_extension]: \"foo\"\n[dynamic_extensions.repeated_extension]: \"bar\"\n[dynamic_extensions.packed_extension]: 12\n[dynamic_extensions.packed_extension]: -34\n[dynamic_extensions.packed_extension]: 56\n[dynamic_extensions.packed_extension]: -78\n2002: 12345\n54321: \"unknown\"\n"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &gtest_ar.message_);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
      if (!bVar2) {
        testing::Message::Message(&local_700);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x51b,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_700)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_700);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
      protobuf::MessageLite::SerializeAsString_abi_cxx11_
                (&local_740,(MessageLite *)&raw_input.position_);
      local_719 = TestUtil::EqualsToSerialized<proto2_unittest::TestDynamicExtensions>
                            ((TestDynamicExtensions *)((long)&message_1.field_0 + 0x50),&local_740);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_718,&local_719,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
      if (!bVar2) {
        testing::Message::Message(&local_748);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&message2.field_0._impl_._cached_size_,(internal *)local_718,
                   (AssertionResult *)
                   "EqualsToSerialized(dynamic_extension, message.SerializeAsString())","false",
                   "true",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_750,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x51f,pcVar8);
        testing::internal::AssertHelper::operator=(&local_750,&local_748);
        testing::internal::AssertHelper::~AssertHelper(&local_750);
        std::__cxx11::string::~string((string *)&message2.field_0._impl_._cached_size_);
        testing::Message::~Message(&local_748);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
      proto2_unittest::TestAllExtensions::TestAllExtensions
                ((TestAllExtensions *)&raw_input_1.position_);
      pvVar10 = (void *)std::__cxx11::string::data();
      iVar3 = std::__cxx11::string::size();
      protobuf::io::ArrayInputStream::ArrayInputStream
                ((ArrayInputStream *)&input_1.extension_factory_,pvVar10,iVar3,-1);
      protobuf::io::CodedInputStream::CodedInputStream
                ((CodedInputStream *)&gtest_ar__4.message_,
                 (ZeroCopyInputStream *)&input_1.extension_factory_);
      protobuf::io::CodedInputStream::SetExtensionRegistry
                ((CodedInputStream *)&gtest_ar__4.message_,(DescriptorPool *)&file,
                 (MessageFactory *)((long)&data.field_2 + 8));
      local_821 = WireFormat::ParseAndMergePartial
                            ((CodedInputStream *)&gtest_ar__4.message_,
                             (Message *)&raw_input_1.position_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_820,&local_821,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
      if (!bVar2) {
        testing::Message::Message(&local_830);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_820,
                   (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &message2)","false",
                   "true",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_838,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x527,pcVar8);
        testing::internal::AssertHelper::operator=(&local_838,&local_830);
        testing::internal::AssertHelper::~AssertHelper(&local_838);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_830);
      }
      bVar2 = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
      if (!bVar2) {
        local_869 = protobuf::io::CodedInputStream::ConsumedEntireMessage
                              ((CodedInputStream *)&gtest_ar__4.message_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_868,&local_869,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
        if (!bVar2) {
          testing::Message::Message(&local_878);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_868,
                     (AssertionResult *)0x1e9589f,"false","true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_880,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x528,pcVar8);
          testing::internal::AssertHelper::operator=(&local_880,&local_878);
          testing::internal::AssertHelper::~AssertHelper(&local_880);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_878);
        }
        bVar2 = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
        if (!bVar2) {
          Message::DebugString_abi_cxx11_(&local_8d0,(Message *)&raw_input.position_);
          Message::DebugString_abi_cxx11_(&local_8f0,(Message *)&raw_input_1.position_);
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                    ((EqHelper *)local_8b0,"message.DebugString()","message2.DebugString()",
                     &local_8d0,&local_8f0);
          std::__cxx11::string::~string((string *)&local_8f0);
          std::__cxx11::string::~string((string *)&local_8d0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
          if (!bVar2) {
            testing::Message::Message(&local_8f8);
            pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&message_extension,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                       ,0x529,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&message_extension,&local_8f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message_extension);
            testing::Message::~Message(&local_8f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
          bVar2 = false;
        }
      }
      protobuf::io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar__4.message_);
      protobuf::io::ArrayInputStream::~ArrayInputStream
                ((ArrayInputStream *)&input_1.extension_factory_);
      proto2_unittest::TestAllExtensions::~TestAllExtensions
                ((TestAllExtensions *)&raw_input_1.position_);
      uVar1 = gtest_ar_.message_;
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__6.message_,
                   "message_extension");
        pFVar11 = FileDescriptor::FindExtensionByName
                            ((FileDescriptor *)
                             uVar1._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,stack0xfffffffffffff6e8);
        local_929 = pFVar11 != (FieldDescriptor *)0x0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_928,&local_929,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
        if (!bVar2) {
          testing::Message::Message(&local_938);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&sub_message,(internal *)local_928,(AssertionResult *)0x1d6e572,
                     "false","true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_940,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x530,pcVar8);
          testing::internal::AssertHelper::operator=(&local_940,&local_938);
          testing::internal::AssertHelper::~AssertHelper(&local_940);
          std::__cxx11::string::~string((string *)&sub_message);
          testing::Message::~Message(&local_938);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
        if (bVar2) {
          pRVar12 = proto2_unittest::TestAllExtensions::GetReflection();
          from = &Reflection::GetMessage
                            (pRVar12,(Message *)&raw_input.position_,pFVar11,(MessageFactory *)0x0)
                  ->super_MessageLite;
          gtest_ar__7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )DynamicCastMessage<proto2_unittest::ForeignMessage>(from);
          local_981[0] = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )gtest_ar__7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl !=
                         (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          )0x0;
          message_00 = (Message *)local_981;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)(local_981 + 1),(bool *)message_00,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)(local_981 + 1));
          if (!bVar2) {
            testing::Message::Message(&local_990);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_2.message_,(internal *)(local_981 + 1),
                       (AssertionResult *)"typed_sub_message != nullptr","false","true",in_R9);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_998,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                       ,0x535,pcVar8);
            message_00 = &local_990;
            testing::internal::AssertHelper::operator=(&local_998,message_00);
            testing::internal::AssertHelper::~AssertHelper(&local_998);
            std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_990);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)(local_981 + 1));
          if (bVar2) {
            local_9d0[1] = 0x1c8;
            local_9d0[0] = proto2_unittest::ForeignMessage::c
                                     ((ForeignMessage *)
                                      gtest_ar__7.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,message_00,extraout_RDX);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_9c8,"456","typed_sub_message->c()",local_9d0 + 1,local_9d0)
            ;
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
            if (!bVar2) {
              testing::Message::Message(&local_9d8);
              pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&dynamic_message_extension,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                         ,0x536,pcVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&dynamic_message_extension,&local_9d8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&dynamic_message_extension);
              testing::Message::~Message(&local_9d8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
            uVar1 = gtest_ar_.message_;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__8.message_,
                       "dynamic_message_extension");
            pFVar11 = FileDescriptor::FindExtensionByName
                                ((FileDescriptor *)
                                 uVar1._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,stack0xfffffffffffff608);
            local_a09 = pFVar11 != (FieldDescriptor *)0x0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_a08,&local_a09,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
            if (!bVar2) {
              testing::Message::Message(&local_a18);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&parent,(internal *)local_a08,
                         (AssertionResult *)"dynamic_message_extension != nullptr","false","true",
                         in_R9);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_a20,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                         ,0x53e,pcVar8);
              testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
              testing::internal::AssertHelper::~AssertHelper(&local_a20);
              std::__cxx11::string::~string((string *)&parent);
              testing::Message::~Message(&local_a18);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
            if (bVar2) {
              this_07 = proto2_unittest::TestAllExtensions::default_instance();
              pRVar12 = Message::GetReflection(&this_07->super_Message);
              pMVar13 = Reflection::GetMessage
                                  (pRVar12,&this_07->super_Message,pFVar11,
                                   (MessageFactory *)((long)&data.field_2 + 8));
              pDVar4 = FieldDescriptor::message_type(pFVar11);
              gtest_ar_3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )DynamicMessageFactory::GetPrototype
                               ((DynamicMessageFactory *)((long)&data.field_2 + 8),pDVar4);
              local_a70 = pMVar13;
              testing::internal::EqHelper::
              Compare<const_google::protobuf::Message_*,_const_google::protobuf::Message_*,_nullptr>
                        ((EqHelper *)local_a68,"prototype","&sub_message",
                         (Message **)&gtest_ar_3.message_,&local_a70);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
              if (!bVar2) {
                testing::Message::Message(&local_a78);
                pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
                testing::internal::AssertHelper::AssertHelper
                          (&local_a80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                           ,0x544,pcVar8);
                testing::internal::AssertHelper::operator=(&local_a80,&local_a78);
                testing::internal::AssertHelper::~AssertHelper(&local_a80);
                testing::Message::~Message(&local_a78);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
    }
    proto2_unittest::TestAllExtensions::~TestAllExtensions
              ((TestAllExtensions *)&raw_input.position_);
    proto2_unittest::TestDynamicExtensions::~TestDynamicExtensions
              ((TestDynamicExtensions *)((long)&message_1.field_0 + 0x50));
    std::__cxx11::string::~string((string *)((long)&dynamic_extension.field_0 + 0x50));
    DynamicMessageFactory::~DynamicMessageFactory
              ((DynamicMessageFactory *)((long)&data.field_2 + 8));
  }
  DescriptorPool::~DescriptorPool((DescriptorPool *)&file);
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_280);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_168);
  return;
}

Assistant:

TEST(ExtensionSetTest, DynamicExtensions) {
  // Test adding a dynamic extension to a compiled-in message object.

  FileDescriptorProto dynamic_proto;
  unittest::TestDynamicExtensions::descriptor()->file()->CopyHeadingTo(
      &dynamic_proto);
  dynamic_proto.clear_dependency();
  dynamic_proto.set_name("dynamic_extensions_test.proto");
  dynamic_proto.add_dependency(
      unittest::TestAllExtensions::descriptor()->file()->name());
  dynamic_proto.set_package("dynamic_extensions");

  // Copy the fields and nested types from TestDynamicExtensions into our new
  // proto, converting the fields into extensions.
  const Descriptor* template_descriptor =
      unittest::TestDynamicExtensions::descriptor();
  DescriptorProto template_descriptor_proto;
  template_descriptor->CopyTo(&template_descriptor_proto);
  dynamic_proto.mutable_message_type()->MergeFrom(
      template_descriptor_proto.nested_type());
  dynamic_proto.mutable_enum_type()->MergeFrom(
      template_descriptor_proto.enum_type());
  dynamic_proto.mutable_extension()->MergeFrom(
      template_descriptor_proto.field());

  // For each extension that we added...
  for (int i = 0; i < dynamic_proto.extension_size(); i++) {
    // Set its extendee to TestAllExtensions.
    FieldDescriptorProto* extension = dynamic_proto.mutable_extension(i);
    extension->set_extendee(
        unittest::TestAllExtensions::descriptor()->full_name());

    // If the field refers to one of the types nested in TestDynamicExtensions,
    // make it refer to the type in our dynamic proto instead.
    std::string prefix =
        absl::StrCat(".", template_descriptor->full_name(), ".");
    if (extension->has_type_name()) {
      std::string* type_name = extension->mutable_type_name();
      if (absl::StartsWith(*type_name, prefix)) {
        type_name->replace(0, prefix.size(), ".dynamic_extensions.");
      }
    }
  }

  // Now build the file, using the generated pool as an underlay.
  DescriptorPool dynamic_pool(DescriptorPool::generated_pool());
  const FileDescriptor* file = dynamic_pool.BuildFile(dynamic_proto);
  ASSERT_TRUE(file != nullptr);
  DynamicMessageFactory dynamic_factory(&dynamic_pool);
  dynamic_factory.SetDelegateToGeneratedFactory(true);

  // Construct a message that we can parse with the extensions we defined.
  // Since the extensions were based off of the fields of TestDynamicExtensions,
  // we can use that message to create this test message.
  std::string data;
  unittest::TestDynamicExtensions dynamic_extension;
  {
    unittest::TestDynamicExtensions message;
    message.set_scalar_extension(123);
    message.set_enum_extension(unittest::FOREIGN_BAR);
    message.set_dynamic_enum_extension(
        unittest::TestDynamicExtensions::DYNAMIC_BAZ);
    message.mutable_message_extension()->set_c(456);
    message.mutable_dynamic_message_extension()->set_dynamic_field(789);
    message.add_repeated_extension("foo");
    message.add_repeated_extension("bar");
    message.add_packed_extension(12);
    message.add_packed_extension(-34);
    message.add_packed_extension(56);
    message.add_packed_extension(-78);

    // Also add some unknown fields.

    // An unknown enum value (for a known field).
    message.mutable_unknown_fields()->AddVarint(
        unittest::TestDynamicExtensions::kDynamicEnumExtensionFieldNumber,
        12345);
    // A regular unknown field.
    message.mutable_unknown_fields()->AddLengthDelimited(54321, "unknown");

    message.SerializeToString(&data);
    dynamic_extension = message;
  }

  // Now we can parse this using our dynamic extension definitions...
  unittest::TestAllExtensions message;
  {
    io::ArrayInputStream raw_input(data.data(), data.size());
    io::CodedInputStream input(&raw_input);
    input.SetExtensionRegistry(&dynamic_pool, &dynamic_factory);
    ASSERT_TRUE(message.ParseFromCodedStream(&input));
    ASSERT_TRUE(input.ConsumedEntireMessage());
  }

  // Can we print it?
  std::string message_text;
  TextFormat::PrintToString(message, &message_text);
  EXPECT_EQ(
      "[dynamic_extensions.scalar_extension]: 123\n"
      "[dynamic_extensions.enum_extension]: FOREIGN_BAR\n"
      "[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\n"
      "[dynamic_extensions.message_extension] {\n"
      "  c: 456\n"
      "}\n"
      "[dynamic_extensions.dynamic_message_extension] {\n"
      "  dynamic_field: 789\n"
      "}\n"
      "[dynamic_extensions.repeated_extension]: \"foo\"\n"
      "[dynamic_extensions.repeated_extension]: \"bar\"\n"
      "[dynamic_extensions.packed_extension]: 12\n"
      "[dynamic_extensions.packed_extension]: -34\n"
      "[dynamic_extensions.packed_extension]: 56\n"
      "[dynamic_extensions.packed_extension]: -78\n"
      "2002: 12345\n"
      "54321: \"unknown\"\n",
      message_text);

  // Can we serialize it?
  EXPECT_TRUE(
      EqualsToSerialized(dynamic_extension, message.SerializeAsString()));

  // What if we parse using the reflection-based parser?
  {
    unittest::TestAllExtensions message2;
    io::ArrayInputStream raw_input(data.data(), data.size());
    io::CodedInputStream input(&raw_input);
    input.SetExtensionRegistry(&dynamic_pool, &dynamic_factory);
    ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &message2));
    ASSERT_TRUE(input.ConsumedEntireMessage());
    EXPECT_EQ(message.DebugString(), message2.DebugString());
  }

  // Are the embedded generated types actually using the generated objects?
  {
    const FieldDescriptor* message_extension =
        file->FindExtensionByName("message_extension");
    ASSERT_TRUE(message_extension != nullptr);
    const Message& sub_message =
        message.GetReflection()->GetMessage(message, message_extension);
    const unittest::ForeignMessage* typed_sub_message =
        google::protobuf::DynamicCastMessage<unittest::ForeignMessage>(&sub_message);
    ASSERT_TRUE(typed_sub_message != nullptr);
    EXPECT_EQ(456, typed_sub_message->c());
  }

  // What does GetMessage() return for the embedded dynamic type if it isn't
  // present?
  {
    const FieldDescriptor* dynamic_message_extension =
        file->FindExtensionByName("dynamic_message_extension");
    ASSERT_TRUE(dynamic_message_extension != nullptr);
    const Message& parent = unittest::TestAllExtensions::default_instance();
    const Message& sub_message = parent.GetReflection()->GetMessage(
        parent, dynamic_message_extension, &dynamic_factory);
    const Message* prototype =
        dynamic_factory.GetPrototype(dynamic_message_extension->message_type());
    EXPECT_EQ(prototype, &sub_message);
  }
}